

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

int count_dups<int>(vector<int,_std::allocator<int>_> *t)

{
  long lVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  size_type sVar3;
  reference pvVar4;
  size_t __n;
  undefined8 uStack_50;
  undefined1 auStack_48 [12];
  int local_3c;
  undefined1 *local_38;
  int local_30;
  int local_2c;
  int j;
  int i;
  unsigned_long __vla_expr0;
  int local_18;
  int local_14;
  int N;
  int dups;
  vector<int,_std::allocator<int>_> *t_local;
  
  local_14 = 0;
  uStack_50 = 0x1146ec;
  _N = t;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(t);
  local_18 = (int)sVar3;
  uStack_50 = 0x1146f8;
  _j = std::vector<int,_std::allocator<int>_>::size(_N);
  lVar1 = -(_j + 0xf & 0xfffffffffffffff0);
  __n = (size_t)local_18;
  local_38 = auStack_48 + lVar1;
  __vla_expr0 = (unsigned_long)auStack_48;
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x114729;
  memset(auStack_48 + lVar1,0,__n);
  for (local_2c = 0; local_2c < local_18; local_2c = local_2c + 1) {
    local_30 = local_2c;
    if ((local_38[local_2c] & 1) == 0) {
      while (pvVar2 = _N, local_30 = local_30 + 1, local_30 < local_18) {
        sVar3 = (size_type)local_2c;
        *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x114766;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,sVar3);
        pvVar2 = _N;
        local_3c = *pvVar4;
        sVar3 = (size_type)local_30;
        *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x114778;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,sVar3);
        if (local_3c == *pvVar4) {
          local_14 = local_14 + 1;
          local_38[local_30] = 1;
        }
      }
    }
  }
  return local_14;
}

Assistant:

int count_dups(std::vector<T> &t)
{
    int dups = 0;
    int N = t.size();
    STACKALLOC(bool, mark, t.size());
    memset(mark, 0, N);
    for(int i=0; i<N; ++i) {
        if(mark[i])
            continue;
        for(int j=i+1; j<N; ++j) {
            if(t[i] == t[j]) {
                dups++;
                mark[j] = true;
            }
        }
    }
    return dups;
}